

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O0

int borg_perma_aux_resist_colluin(void)

{
  _Bool _Var1;
  int local_c;
  
  if ((byte)(borg.temp.res_fire + borg.temp.res_acid + borg.temp.res_pois + borg.temp.res_elec +
            borg.temp.res_cold) < 3) {
    if (borg_fighting_unique == L'\0') {
      local_c = 0;
    }
    else {
      _Var1 = borg_equips_item(act_resist_all,true);
      if ((_Var1) || (_Var1 = borg_equips_item(act_rage_bless_resist,true), _Var1)) {
        if ((borg_simulate & 1U) == 0) {
          _Var1 = borg_activate_item(act_resist_all);
          if ((_Var1) || (_Var1 = borg_activate_item(act_rage_bless_resist), _Var1)) {
            borg.no_rest_prep = 21000;
          }
          local_c = 2;
        }
        else {
          local_c = 2;
        }
      }
      else {
        local_c = 0;
      }
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int borg_perma_aux_resist_colluin(void)
{
    if (borg.temp.res_fire + borg.temp.res_acid + borg.temp.res_pois
            + borg.temp.res_elec + borg.temp.res_cold
        >= 3)
        return 0;

    /* Only use it when Unique is close */
    if (!borg_fighting_unique)
        return 0;

    if (!borg_equips_item(act_resist_all, true)
        && !borg_equips_item(act_rage_bless_resist, true))
        return 0;

    /* Simulation */
    if (borg_simulate)
        return 2;

    /* do it! */
    if (borg_activate_item(act_resist_all)
        || borg_activate_item(act_rage_bless_resist)) {
        /* No resting to recoup mana */
        borg.no_rest_prep = 21000;
    }

    /* Value */
    return 2;
}